

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O2

int BN_MONT_CTX_set(BN_MONT_CTX *mont,BIGNUM *mod,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *in;
  BIGNUM *pBVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long buf [2];
  BIGNUM tmod;
  
  iVar1 = BN_is_zero((BIGNUM *)mod);
  uVar5 = 0;
  if (iVar1 == 0) {
    BN_CTX_start(ctx);
    in = BN_CTX_get(ctx);
    uVar5 = 0;
    uVar4 = 0;
    if (in != (BIGNUM *)0x0) {
      pBVar2 = BN_copy(&mont->N,mod);
      if (pBVar2 != (BIGNUM *)0x0) {
        pBVar2 = &mont->RR;
        (mont->N).neg = 0;
        bn_init(&tmod);
        tmod.d = buf;
        tmod.dmax = 2;
        tmod.neg = 0;
        iVar1 = BN_num_bits(mod);
        mont->ri = (iVar1 + 0x3f) / 0x40 << 6;
        BN_zero_ex((BIGNUM *)pBVar2);
        iVar1 = BN_set_bit(pBVar2,0x40);
        if (iVar1 != 0) {
          buf[0] = *mod->d;
          buf[1] = 0;
          tmod.top = (int)(buf[0] != 0);
          iVar1 = BN_mod_inverse_Lehmer((BIGNUM *)in,(BIGNUM *)pBVar2,&tmod,(BN_CTX *)ctx);
          uVar5 = uVar4;
          if (iVar1 != 0) {
            iVar1 = BN_lshift(in,in,0x40);
            if (iVar1 != 0) {
              iVar1 = BN_is_zero((BIGNUM *)in);
              if (iVar1 == 0) {
                iVar1 = BN_sub_word(in,1);
              }
              else {
                iVar1 = BN_set_word(in,0xffffffffffffffff);
              }
              if (iVar1 != 0) {
                iVar1 = BN_div(in,(BIGNUM *)0x0,in,(BIGNUM *)&tmod,ctx);
                if (iVar1 != 0) {
                  uVar5 = 0;
                  if (in->top < 1) {
                    uVar3 = 0;
                  }
                  else {
                    uVar3 = *in->d;
                  }
                  mont->n0[0] = uVar3;
                  mont->n0[1] = 0;
                  BN_zero_ex((BIGNUM *)pBVar2);
                  iVar1 = BN_set_bit(pBVar2,mont->ri * 2);
                  if (iVar1 != 0) {
                    iVar1 = BN_div((BIGNUM *)0x0,pBVar2,pBVar2,&mont->N,ctx);
                    uVar5 = (uint)(iVar1 != 0);
                  }
                }
              }
            }
          }
        }
      }
    }
    BN_CTX_end(ctx);
  }
  return uVar5;
}

Assistant:

int BN_MONT_CTX_set(BN_MONT_CTX *mont, const BIGNUM *mod, BN_CTX *ctx)
{
    int ret = GML_ERROR;
    BIGNUM *Ri, *R;

    if (BN_is_zero(mod))
        return 0;

    BN_CTX_start(ctx);
    if ((Ri = BN_CTX_get(ctx)) == NULL)
        goto err;
    R = &(mont->RR);            /* grab RR as a temp */
    if (!BN_copy(&(mont->N), mod))
        goto err;               /* Set N */
    mont->N.neg = 0;

#ifdef MONT_WORD
    {
        BIGNUM tmod;
        BN_ULONG buf[2];

        bn_init(&tmod);
        tmod.d = buf;
        tmod.dmax = 2;
        tmod.neg = 0;

        mont->ri = (BN_num_bits(mod) + (BN_BITS2 - 1)) / BN_BITS2 * BN_BITS2;

# if (BN_BITS2<=32)
        /*
         * Only certain BN_BITS2<=32 platforms actually make use of n0[1],
         * and we could use the #else case (with a shorter R value) for the
         * others.  However, currently only the assembler files do know which
         * is which.
         */

        BN_zero(R);
        if (!(BN_set_bit(R, 2 * BN_BITS2)))
            goto err;

        tmod.top = 0;
        if ((buf[0] = mod->d[0]))
            tmod.top = 1;
        if ((buf[1] = mod->top > 1 ? mod->d[1] : 0))
            tmod.top = 2;

        if ((BN_mod_inverse(Ri, R, &tmod, ctx)) == NULL)
            goto err;
        if (!BN_lshift(Ri, Ri, 2 * BN_BITS2))
            goto err;           /* R*Ri */
        if (!BN_is_zero(Ri)) {
            if (!BN_sub_word(Ri, 1))
                goto err;
        } else {                /* if N mod word size == 1 */

            if (bn_expand(Ri, (int)sizeof(BN_ULONG) * 2) == NULL)
                goto err;
            /* Ri-- (mod double word size) */
            Ri->neg = 0;
            Ri->d[0] = BN_MASK2;
            Ri->d[1] = BN_MASK2;
            Ri->top = 2;
        }
        if (!BN_div(Ri, NULL, Ri, &tmod, ctx))
            goto err;
        /*
         * Ni = (R*Ri-1)/N, keep only couple of least significant words:
         */
        mont->n0[0] = (Ri->top > 0) ? Ri->d[0] : 0;
        mont->n0[1] = (Ri->top > 1) ? Ri->d[1] : 0;
# else
        BN_zero(R);
        if (!(BN_set_bit(R, BN_BITS2)))
            goto err;           /* R */

        buf[0] = mod->d[0];     /* tmod = N mod word size */
        buf[1] = 0;
        tmod.top = buf[0] != 0 ? 1 : 0;
        /* Ri = R^-1 mod N */
        if (!(BN_mod_inverse_Lehmer(Ri, R, &tmod, ctx)))
            goto err;
        if (!BN_lshift(Ri, Ri, BN_BITS2))
            goto err;           /* R*Ri */
        if (!BN_is_zero(Ri)) {
            if (!BN_sub_word(Ri, 1))
                goto err;
        } else {                /* if N mod word size == 1 */

            if (!BN_set_word(Ri, BN_MASK2))
                goto err;       /* Ri-- (mod word size) */
        }
        if (!BN_div(Ri, NULL, Ri, &tmod, ctx))
            goto err;
        /*
         * Ni = (R*Ri-1)/N, keep only least significant word:
         */
        mont->n0[0] = (Ri->top > 0) ? Ri->d[0] : 0;
        mont->n0[1] = 0;
# endif
    }
#else                           /* !MONT_WORD */
    {                           /* bignum version */
        mont->ri = BN_num_bits(&mont->N);
        BN_zero(R);
        if (!BN_set_bit(R, mont->ri))
            goto err;           /* R = 2^ri */
        /* Ri = R^-1 mod N */
        if ((BN_mod_inverse_Lehmer(Ri, R, &mont->N, ctx)) == NULL)
            goto err;
        if (!BN_lshift(Ri, Ri, mont->ri))
            goto err;           /* R*Ri */
        if (!BN_sub_word(Ri, 1))
            goto err;
        /*
         * Ni = (R*Ri-1) / N
         */
        if (!BN_div(&(mont->Ni), NULL, Ri, &mont->N, ctx))
            goto err;
    }
#endif

    /* setup RR for conversions */
    BN_zero(&(mont->RR));
    if (!BN_set_bit(&(mont->RR), mont->ri * 2))
        goto err;
    if (!BN_mod(&(mont->RR), &(mont->RR), &(mont->N), ctx))
        goto err;

    ret = 1;
 err:
    BN_CTX_end(ctx);
    return ret;
}